

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearAction::~IfcStructuralLinearAction
          (IfcStructuralLinearAction *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x48 = 0x99ff70;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x30 = 0x9a0088;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x99ff98;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xe0 = 0x99ffc0;
  this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.GlobalOrLocal._M_dataplus._M_p =
       (pointer)0x99ffe8;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.field_0x148 =
       0x9a0010;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.field_0x180 = 0x9a0038;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject =
       0x9a0060;
  puVar2 = *(undefined1 **)
            &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject.field_0x10;
  puVar1 = &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
            super_IfcObject.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.
            super_IfcObject.field_0x48;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x48 = 0x9a0238;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x30 = 0x9a0328;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x9a0260;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xe0 = 0x9a0288;
  this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.GlobalOrLocal._M_dataplus._M_p =
       "r\x13R";
  *(undefined8 *)&this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.field_0x148 =
       0x9a02d8;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.field_0x180 = 0x9a0300;
  if (*(undefined1 **)&this[-1].field_0x190 != &this[-1].field_0x1a0) {
    operator_delete(*(undefined1 **)&this[-1].field_0x190,*(long *)&this[-1].field_0x1a0 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)puVar1,&PTR_construction_vtable_24__009a00a8);
  operator_delete(puVar1,0x1c0);
  return;
}

Assistant:

IfcStructuralLinearAction() : Object("IfcStructuralLinearAction") {}